

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
llbuild::core::BuildEngine::addCancellationDelegate(BuildEngine *this,CancellationDelegate *del)

{
  CancellationDelegate *del_local;
  BuildEngine *this_local;
  
  anon_unknown.dwarf_12f2cc::BuildEngineImpl::addCancellationDelegate
            ((BuildEngineImpl *)this->impl,del);
  return;
}

Assistant:

void BuildEngine::addCancellationDelegate(CancellationDelegate* del) {
  static_cast<BuildEngineImpl*>(impl)->addCancellationDelegate(std::move(del));
}